

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<int>(logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args)

{
  string_view fmt_00;
  string_view_t msg;
  string_view_t a_logger_name;
  remove_cvref_t<fmt::v11::basic_appender<char>_> rVar1;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RDI;
  undefined4 *in_R8;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffae0;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffae8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffaf0;
  basic_appender<char> *in_stack_fffffffffffffb18;
  format_args in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb30;
  buffer<char> *this_00;
  size_t in_stack_fffffffffffffb38;
  level_enum lvl_00;
  log_msg *this_01;
  undefined8 *puVar3;
  size_t in_stack_fffffffffffffb70;
  source_loc in_stack_fffffffffffffb80;
  basic_string_view<char> local_3f8 [2];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  log_msg *local_3c8;
  buffer<char> *local_360;
  log_msg *local_358;
  char *local_350;
  undefined8 local_348;
  log_msg **local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  basic_appender<char> local_320 [4];
  buffer<char> local_300 [9];
  undefined1 local_1da;
  byte local_1d9;
  undefined4 *local_1d8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined4 *local_1b0;
  log_msg *local_1a8;
  char *local_1a0;
  log_msg **local_198;
  undefined8 *local_190;
  undefined4 local_3c;
  log_msg **local_38;
  
  puVar3 = (undefined8 *)&stack0x00000008;
  local_1d8 = in_R8;
  local_1c0 = in_RDX;
  uStack_1b8 = in_RCX;
  local_1d9 = should_log(in_stack_fffffffffffffae8,
                         (level_enum)((ulong)in_stack_fffffffffffffae0 >> 0x20));
  local_1da = details::backtracer::enabled((backtracer *)0x178e14);
  if (((local_1d9 & 1) != 0) || ((bool)local_1da)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffae0,(allocator<char> *)in_stack_fffffffffffffad8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_320,local_300);
    local_338 = local_1c0;
    uStack_330 = uStack_1b8;
    local_1b0 = local_1d8;
    local_3c = *local_1d8;
    local_38 = &local_1a8;
    local_1a8._0_4_ = local_3c;
    this_01 = local_1a8;
    local_358 = this_01;
    local_350 = local_1a0;
    local_190 = &local_348;
    local_198 = &local_358;
    local_348 = 1;
    fmt_00.size_ = in_stack_fffffffffffffb38;
    fmt_00.data_ = in_stack_fffffffffffffb30;
    local_340 = local_198;
    rVar1 = ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                      (in_stack_fffffffffffffb18,fmt_00,in_stack_fffffffffffffb20);
    local_3c8 = (log_msg *)puVar3[2];
    local_3d8 = *puVar3;
    uStack_3d0 = puVar3[1];
    local_360 = rVar1.container;
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    lvl_00 = (level_enum)((ulong)rVar1.container >> 0x20);
    this_00 = local_300;
    s = ::fmt::v11::detail::buffer<char>::data(this_00);
    count = ::fmt::v11::detail::buffer<char>::size(this_00);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_3f8,s,count);
    a_logger_name.size_ = in_stack_fffffffffffffb70;
    a_logger_name.data_ = in_RDI;
    msg.size_ = (size_t)puVar3;
    msg.data_ = local_1a0;
    uVar2 = uStack_3d0;
    log_msg_00 = local_3c8;
    details::log_msg::log_msg(this_01,in_stack_fffffffffffffb80,a_logger_name,lvl_00,msg);
    log_it_(in_stack_fffffffffffffaf0,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x17906c);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }